

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

IOTHUB_MESSAGING_HANDLE
IoTHubMessaging_LL_Create(IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  IOTHUB_SERVICE_CLIENT_AUTH *serviceClientAuth;
  LOGGER_LOG l;
  IOTHUB_MESSAGING_HANDLE result;
  IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle_local;
  
  if (serviceClientHandle == (IOTHUB_SERVICE_CLIENT_AUTH_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Create",0x3a2,1,
                "serviceClientHandle input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (serviceClientHandle->hostname == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Create",0x3ab,1,
                "authInfo->hostName input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (serviceClientHandle->iothubName == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Create",0x3b0,1,
                "authInfo->iothubName input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (serviceClientHandle->iothubSuffix == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Create",0x3b5,1,
                "authInfo->iothubSuffix input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (serviceClientHandle->keyName == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Create",0x3ba,1,
                "authInfo->keyName input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (serviceClientHandle->sharedAccessKey == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"IoTHubMessaging_LL_Create",0x3bf,1,
                "authInfo->sharedAccessKey input parameter cannot be NULL");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0xe0);
    if (l == (LOGGER_LOG)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"IoTHubMessaging_LL_Create",0x3c4,1,"Malloc failed for IOTHUB_MESSAGING");
      }
    }
    else {
      memset(l,0,0xe0);
      iVar1 = mallocAndStrcpy_s((char **)(l + 8),serviceClientHandle->hostname);
      if (iVar1 == 0) {
        iVar1 = mallocAndStrcpy_s((char **)(l + 0x10),serviceClientHandle->iothubName);
        if (iVar1 == 0) {
          iVar1 = mallocAndStrcpy_s((char **)(l + 0x18),serviceClientHandle->iothubSuffix);
          if (iVar1 == 0) {
            iVar1 = mallocAndStrcpy_s((char **)(l + 0x20),serviceClientHandle->sharedAccessKey);
            if (iVar1 == 0) {
              iVar1 = mallocAndStrcpy_s((char **)(l + 0x28),serviceClientHandle->keyName);
              if (iVar1 == 0) {
                pSVar3 = singlylinkedlist_create();
                *(SINGLYLINKEDLIST_HANDLE *)(l + 0xc0) = pSVar3;
                if (pSVar3 == (SINGLYLINKEDLIST_HANDLE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                              ,"IoTHubMessaging_LL_Create",0x3f4,1,
                              "Failed creating send_callback_data");
                  }
                  free(*(void **)(l + 8));
                  free(*(void **)(l + 0x10));
                  free(*(void **)(l + 0x18));
                  free(*(void **)(l + 0x20));
                  free(*(void **)(l + 0x28));
                  free(l);
                  l = (LOGGER_LOG)0x0;
                }
                else {
                  *(undefined8 *)(l + 200) = 0xffffffffffffffff;
                }
              }
              else {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                            ,"IoTHubMessaging_LL_Create",0x3ea,1,
                            "mallocAndStrcpy_s failed for keyName");
                }
                free(*(void **)(l + 8));
                free(*(void **)(l + 0x10));
                free(*(void **)(l + 0x18));
                free(*(void **)(l + 0x20));
                free(l);
                l = (LOGGER_LOG)0x0;
              }
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"IoTHubMessaging_LL_Create",0x3e1,1,
                          "mallocAndStrcpy_s failed for sharedAccessKey");
              }
              free(*(void **)(l + 8));
              free(*(void **)(l + 0x10));
              free(*(void **)(l + 0x18));
              free(l);
              l = (LOGGER_LOG)0x0;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"IoTHubMessaging_LL_Create",0x3d9,1,
                        "mallocAndStrcpy_s failed for iothubSuffix");
            }
            free(*(void **)(l + 8));
            free(*(void **)(l + 0x10));
            free(l);
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"IoTHubMessaging_LL_Create",0x3d2,1,"mallocAndStrcpy_s failed for iothubName"
                     );
          }
          free(*(void **)(l + 8));
          free(l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"IoTHubMessaging_LL_Create",0x3cc,1,"mallocAndStrcpy_s failed for hostName");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (IOTHUB_MESSAGING_HANDLE)l;
}

Assistant:

IOTHUB_MESSAGING_HANDLE IoTHubMessaging_LL_Create(IOTHUB_SERVICE_CLIENT_AUTH_HANDLE serviceClientHandle)
{
    IOTHUB_MESSAGING_HANDLE result;

    if (serviceClientHandle == NULL)
    {
        LogError("serviceClientHandle input parameter cannot be NULL");
        result = NULL;
    }
    else
    {
        IOTHUB_SERVICE_CLIENT_AUTH* serviceClientAuth = (IOTHUB_SERVICE_CLIENT_AUTH*)serviceClientHandle;

        if (serviceClientAuth->hostname == NULL)
        {
            LogError("authInfo->hostName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->iothubName == NULL)
        {
            LogError("authInfo->iothubName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->iothubSuffix == NULL)
        {
            LogError("authInfo->iothubSuffix input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->keyName == NULL)
        {
            LogError("authInfo->keyName input parameter cannot be NULL");
            result = NULL;
        }
        else if (serviceClientAuth->sharedAccessKey == NULL)
        {
            LogError("authInfo->sharedAccessKey input parameter cannot be NULL");
            result = NULL;
        }
        else if ((result = (IOTHUB_MESSAGING*)malloc(sizeof(IOTHUB_MESSAGING))) == NULL)
        {
            LogError("Malloc failed for IOTHUB_MESSAGING");
        }
        else
        {
            memset(result, 0, sizeof(IOTHUB_MESSAGING) );

            if (mallocAndStrcpy_s(&result->hostname, serviceClientAuth->hostname) != 0)
            {
                LogError("mallocAndStrcpy_s failed for hostName");
                free(result);
                result = NULL;
            }
            else if (mallocAndStrcpy_s(&result->iothubName, serviceClientAuth->iothubName) != 0)
            {
                LogError("mallocAndStrcpy_s failed for iothubName");
                free(result->hostname);
                free(result);
                result = NULL;
            }
            else if (mallocAndStrcpy_s(&result->iothubSuffix, serviceClientAuth->iothubSuffix) != 0)
            {
                LogError("mallocAndStrcpy_s failed for iothubSuffix");
                free(result->hostname);
                free(result->iothubName);
                free(result);
                result = NULL;
            }
            else if (mallocAndStrcpy_s(&result->sharedAccessKey, serviceClientAuth->sharedAccessKey) != 0)
            {
                LogError("mallocAndStrcpy_s failed for sharedAccessKey");
                free(result->hostname);
                free(result->iothubName);
                free(result->iothubSuffix);
                free(result);
                result = NULL;
            }
            else if (mallocAndStrcpy_s(&result->keyName, serviceClientAuth->keyName) != 0)
            {
                LogError("mallocAndStrcpy_s failed for keyName");
                free(result->hostname);
                free(result->iothubName);
                free(result->iothubSuffix);
                free(result->sharedAccessKey);
                free(result);
                result = NULL;
            }
            else if ((result->send_callback_data = singlylinkedlist_create()) == NULL)
            {
                LogError("Failed creating send_callback_data");
                free(result->hostname);
                free(result->iothubName);
                free(result->iothubSuffix);
                free(result->sharedAccessKey);
                free(result->keyName);
                free(result);
                result = NULL;
            }
            else
            {
                result->max_send_queue_size = DEFAULT_MAX_SEND_QUEUE_SIZE;
            }
        }
    }
    return result;
}